

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator_factory.hpp
# Opt level: O1

unique_ptr<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::make_not_validator
          (keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent,
          anchor_uri_map_type *anchor_dict)

{
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *this_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  keys;
  string not_key [1];
  uri schema_location;
  undefined1 local_130 [8];
  string local_128;
  _Any_data local_100;
  _Manager_type local_f0 [2];
  string local_e0;
  uri local_c0;
  
  local_128._M_dataplus._M_p = local_130 + 0x18;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_130 + 8),"not","");
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  make_schema_location
            (&local_c0,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)sch,(string *)(local_130 + 8));
  if (local_128._M_dataplus._M_p != local_130 + 0x18) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_128._M_dataplus._M_p = local_130 + 0x18;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_130 + 8),"not","");
  local_100._M_unused._0_8_ = (undefined8)(local_130 + 0x40);
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_130 + 0x30),"not","");
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  get_custom_message(&local_e0,
                     (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)sch,(string *)(local_130 + 0x30));
  keys.size_ = (size_type)(local_130 + 8);
  keys.data_ = (pointer)parent;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ::make_cross_draft_schema_validator
            ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)local_130,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)(context->base_uri_).uri_.uri_string_._M_dataplus._M_p,sch,keys,
             (anchor_uri_map_type *)0x1);
  this_00 = (schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)operator_new(0xf0);
  not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  not_validator((not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)this_00,
                (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)anchor_dict,
                &local_c0,&local_e0,(schema_validator_ptr_type *)local_130);
  this->factory_ = this_00;
  if ((_Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
       )local_130 !=
      (_Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    (*((validator_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *)local_130)->_vptr_validator_base[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_100._M_unused._0_8_ != local_130 + 0x40) {
    operator_delete(local_100._M_unused._M_object,(ulong)(local_f0[0] + 1));
  }
  if (local_128._M_dataplus._M_p != local_130 + 0x18) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.uri_string_._M_dataplus._M_p != &local_c0.uri_string_.field_2) {
    operator_delete(local_c0.uri_string_._M_dataplus._M_p,
                    local_c0.uri_string_.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<not_validator<Json>> make_not_validator(const compilation_context<Json>& context, 
            const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict)
        {
            uri schema_location = context.make_schema_location("not");
            std::string not_key[] = { "not" };
            return jsoncons::make_unique<not_validator<Json>>(parent, schema_location, context.get_custom_message("not"), 
                factory_->make_cross_draft_schema_validator(context, sch, not_key, anchor_dict));
        }